

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solitaire.cpp
# Opt level: O0

void __thiscall
solitaire::Solitaire::tryAddPulledOutCardToHand
          (Solitaire *this,optional<solitaire::cards::Card> *card,SnapshotPtr *snapshot)

{
  bool bVar1;
  pointer pMVar2;
  Card *__x;
  unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>
  local_28;
  SnapshotPtr *local_20;
  SnapshotPtr *snapshot_local;
  optional<solitaire::cards::Card> *card_local;
  Solitaire *this_local;
  
  local_20 = snapshot;
  snapshot_local = (SnapshotPtr *)card;
  card_local = (optional<solitaire::cards::Card> *)this;
  bVar1 = std::optional::operator_cast_to_bool((optional *)card);
  if (bVar1) {
    pMVar2 = std::
             unique_ptr<solitaire::archivers::interfaces::MoveCardsOperationSnapshotCreator,_std::default_delete<solitaire::archivers::interfaces::MoveCardsOperationSnapshotCreator>_>
             ::operator->(&this->moveCardsOperationSnapshotCreator);
    std::
    unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>
    ::unique_ptr(&local_28,snapshot);
    (*pMVar2->_vptr_MoveCardsOperationSnapshotCreator[3])(pMVar2,&local_28);
    std::
    unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>
    ::~unique_ptr(&local_28);
    __x = std::optional<solitaire::cards::Card>::value
                    ((optional<solitaire::cards::Card> *)snapshot_local);
    std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>::push_back
              (&this->cardsInHand,__x);
  }
  return;
}

Assistant:

void Solitaire::tryAddPulledOutCardToHand(
    const std::optional<Card>& card, SnapshotPtr snapshot)
{
    if (card) {
        moveCardsOperationSnapshotCreator->saveSourcePileSnapshot(std::move(snapshot));
        cardsInHand.push_back(card.value());
    }
}